

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O0

int XMLSearch_search_remove_attribute(XMLSearch *search,int i_attr)

{
  XMLAttribute *local_28;
  XMLAttribute *pt;
  int i_attr_local;
  XMLSearch *search_local;
  
  if (((search == (XMLSearch *)0x0) || (i_attr < 0)) || (search->n_attributes <= i_attr)) {
    search_local._4_4_ = -1;
  }
  else {
    if (search->n_attributes == 1) {
      local_28 = (XMLAttribute *)0x0;
    }
    else {
      local_28 = (XMLAttribute *)malloc((long)(search->n_attributes + -1) * 0x18);
      if (local_28 == (XMLAttribute *)0x0) {
        return -1;
      }
    }
    if (search->attributes[i_attr].name != (SXML_CHAR *)0x0) {
      free(search->attributes[i_attr].name);
    }
    if (search->attributes[i_attr].value != (SXML_CHAR *)0x0) {
      free(search->attributes[i_attr].value);
    }
    if (local_28 != (XMLAttribute *)0x0) {
      memcpy(local_28,search->attributes,(long)i_attr * 0x18);
      memcpy(local_28 + i_attr,search->attributes + (i_attr + 1),
             (long)((search->n_attributes - i_attr) + -1) * 0x18);
    }
    if (search->attributes != (XMLAttribute *)0x0) {
      free(search->attributes);
    }
    search->attributes = local_28;
    search->n_attributes = search->n_attributes + -1;
    search_local._4_4_ = search->n_attributes;
  }
  return search_local._4_4_;
}

Assistant:

int XMLSearch_search_remove_attribute(XMLSearch* search, int i_attr)
{
	XMLAttribute* pt;

	if (search == NULL || i_attr < 0 || i_attr >= search->n_attributes)
		return -1;

	/* Free attribute fields first */
	if (search->n_attributes == 1)
		pt = NULL;
	else {
		pt = (XMLAttribute*)__malloc((search->n_attributes - 1) * sizeof(XMLAttribute));
		if (pt == NULL)
			return -1;
	}
	if (search->attributes[i_attr].name != NULL)
		__free(search->attributes[i_attr].name);
	if (search->attributes[i_attr].value != NULL)
		__free(search->attributes[i_attr].value);

	if (pt != NULL) {
		memcpy(pt, search->attributes, i_attr * sizeof(XMLAttribute));
		memcpy(&pt[i_attr], &search->attributes[i_attr + 1], (search->n_attributes - i_attr - 1) * sizeof(XMLAttribute));
	}
	if (search->attributes)
		__free(search->attributes);
	search->attributes = pt;
	search->n_attributes--;

	return search->n_attributes;
}